

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ObjectDefineProperties(JSContext *ctx,JSValue obj,JSValue properties)

{
  JSValue obj_00;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue desc_00;
  JSValue obj_01;
  JSValue val;
  int iVar1;
  JSContext *in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  undefined8 in_R8;
  JSValue JVar2;
  int in_stack_0000000c;
  JSObject *in_stack_00000010;
  uint32_t *in_stack_00000018;
  JSPropertyEnum **in_stack_00000020;
  JSContext *in_stack_00000028;
  int ret;
  uint32_t i;
  uint32_t len;
  JSPropertyEnum *atoms;
  JSObject *p;
  JSValue desc;
  JSValue props;
  BOOL in_stack_00000110;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  JSContext *in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  int64_t in_stack_ffffffffffffff30;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  JSAtom in_stack_ffffffffffffff7c;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  int32_t flags;
  undefined4 uVar6;
  undefined4 local_30;
  undefined8 local_10;
  undefined8 local_8;
  
  flags = in_RSI.int32;
  uVar6 = in_RSI._4_4_;
  local_94 = -1;
  JVar2.tag = in_RDX;
  JVar2.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar2);
  if (iVar1 == 0) {
    JS_ThrowTypeErrorNotAnObject((JSContext *)0x1aae5e);
    local_30 = -1;
  }
  else {
    val.tag._0_4_ = flags;
    val.u = (JSValueUnion)in_R8;
    val.tag._4_4_ = uVar6;
    JVar2 = JS_ToObject(in_RCX,val);
    local_c8 = JVar2.u;
    local_c0 = JVar2.tag;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 == 0) {
      JVar5 = local_c8;
      iVar1 = JS_GetOwnPropertyNamesInternal
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                         in_stack_0000000c);
      if (-1 < iVar1) {
        for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
          v.tag = in_stack_ffffffffffffff30;
          v.u.ptr = in_stack_ffffffffffffff28.ptr;
          JS_FreeValue(in_stack_ffffffffffffff20,v);
          in_stack_ffffffffffffff18 = 0;
          obj_00.tag = (int64_t)ctx;
          obj_00.u = (JSValueUnion)props.tag;
          JVar2 = JS_GetPropertyInternal
                            ((JSContext *)desc.u.ptr,obj_00,p._4_4_,(JSValue)stack0x00000078,
                             in_stack_00000110);
          local_10 = JVar2.u;
          local_8 = JVar2.tag;
          JVar3 = local_10;
          iVar4 = local_8;
          iVar1 = JS_IsException(JVar2);
          in_stack_ffffffffffffff28 = local_10;
          in_stack_ffffffffffffff30 = local_8;
          if (iVar1 != 0) goto LAB_001ab095;
          in_stack_ffffffffffffff18 = 0x4000;
          obj_01.tag = local_c0;
          obj_01.u.float64 = JVar5.float64;
          desc_00.tag = iVar4;
          desc_00.u.ptr = JVar3.ptr;
          iVar1 = JS_DefinePropertyDesc
                            ((JSContext *)local_c8,obj_01,in_stack_ffffffffffffff7c,desc_00,flags);
          in_stack_ffffffffffffff28 = local_10;
          in_stack_ffffffffffffff30 = local_8;
          if (iVar1 < 0) goto LAB_001ab095;
        }
        local_94 = 0;
      }
LAB_001ab095:
      js_free_prop_enum(in_stack_ffffffffffffff20,
                        (JSPropertyEnum *)
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
      v_00.tag = in_stack_ffffffffffffff30;
      v_00.u.ptr = in_stack_ffffffffffffff28.ptr;
      JS_FreeValue(in_stack_ffffffffffffff20,v_00);
      v_01.tag = in_stack_ffffffffffffff30;
      v_01.u.ptr = in_stack_ffffffffffffff28.ptr;
      JS_FreeValue(in_stack_ffffffffffffff20,v_01);
      local_30 = local_94;
    }
    else {
      local_30 = -1;
    }
  }
  return local_30;
}

Assistant:

static __exception int JS_ObjectDefineProperties(JSContext *ctx,
                                                 JSValueConst obj,
                                                 JSValueConst properties)
{
    JSValue props, desc;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i;
    int ret = -1;

    if (!JS_IsObject(obj)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    desc = JS_UNDEFINED;
    props = JS_ToObject(ctx, properties);
    if (JS_IsException(props))
        return -1;
    p = JS_VALUE_GET_OBJ(props);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, JS_GPN_ENUM_ONLY | JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK) < 0)
        goto exception;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, desc);
        desc = JS_GetProperty(ctx, props, atoms[i].atom);
        if (JS_IsException(desc))
            goto exception;
        if (JS_DefinePropertyDesc(ctx, obj, atoms[i].atom, desc, JS_PROP_THROW) < 0)
            goto exception;
    }
    ret = 0;

exception:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, props);
    JS_FreeValue(ctx, desc);
    return ret;
}